

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

void bcache_remove_dirty_blocks(filemgr *file)

{
  __pointer_type fname_item_00;
  fnamedic_item *fname_item;
  
  fname_item_00 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x11d12a);
  if (fname_item_00 != (__pointer_type)0x0) {
    _flush_dirty_blocks(fname_item_00,false,true,false);
  }
  return;
}

Assistant:

void bcache_remove_dirty_blocks(struct filemgr *file)
{
    struct fnamedic_item *fname_item;

    fname_item = file->bcache;

    if (fname_item) {
        // Note that this function is only invoked as part of database file close or
        // removal when there are no database handles for a given file. Therefore,
        // we don't need to grab all the shard locks at once.

        // remove all dirty blocks
        _flush_dirty_blocks(fname_item, false, true, false);
    }
}